

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvalContext.cpp
# Opt level: O3

void __thiscall slang::ast::EvalContext::reset(EvalContext *this)

{
  size_type sVar1;
  pointer this_00;
  pointer pDVar2;
  long lVar3;
  
  *(undefined8 *)&this->steps = 0;
  *(undefined8 *)((long)&this->disableTarget + 4) = 0;
  *(undefined4 *)((long)&this->queueTarget + 4) = 0;
  sVar1 = (this->stack).super_SmallVectorBase<slang::ast::EvalContext::Frame>.len;
  if (sVar1 != 0) {
    this_00 = (this->stack).super_SmallVectorBase<slang::ast::EvalContext::Frame>.data_;
    lVar3 = sVar1 * 0x50;
    do {
      std::
      _Rb_tree<const_slang::ast::ValueSymbol_*,_std::pair<const_slang::ast::ValueSymbol_*const,_slang::ConstantValue>,_std::_Select1st<std::pair<const_slang::ast::ValueSymbol_*const,_slang::ConstantValue>_>,_std::less<const_slang::ast::ValueSymbol_*>,_std::allocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::ConstantValue>_>_>
      ::~_Rb_tree((_Rb_tree<const_slang::ast::ValueSymbol_*,_std::pair<const_slang::ast::ValueSymbol_*const,_slang::ConstantValue>,_std::_Select1st<std::pair<const_slang::ast::ValueSymbol_*const,_slang::ConstantValue>_>,_std::less<const_slang::ast::ValueSymbol_*>,_std::allocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::ConstantValue>_>_>
                   *)this_00);
      this_00 = this_00 + 1;
      lVar3 = lVar3 + -0x50;
    } while (lVar3 != 0);
  }
  (this->stack).super_SmallVectorBase<slang::ast::EvalContext::Frame>.len = 0;
  (this->lvalStack).super_SmallVectorBase<slang::ast::LValue_*>.len = 0;
  sVar1 = (this->diags).super_SmallVector<slang::Diagnostic,_2UL>.
          super_SmallVectorBase<slang::Diagnostic>.len;
  if (sVar1 != 0) {
    pDVar2 = (this->diags).super_SmallVector<slang::Diagnostic,_2UL>.
             super_SmallVectorBase<slang::Diagnostic>.data_;
    lVar3 = sVar1 * 0x70;
    do {
      std::ranges::__destroy_at_fn::operator()<slang::Diagnostic>
                ((__destroy_at_fn *)&std::ranges::destroy_at,pDVar2);
      pDVar2 = pDVar2 + 1;
      lVar3 = lVar3 + -0x70;
    } while (lVar3 != 0);
  }
  (this->diags).super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.
  len = 0;
  sVar1 = (this->warnings).super_SmallVector<slang::Diagnostic,_2UL>.
          super_SmallVectorBase<slang::Diagnostic>.len;
  if (sVar1 != 0) {
    pDVar2 = (this->warnings).super_SmallVector<slang::Diagnostic,_2UL>.
             super_SmallVectorBase<slang::Diagnostic>.data_;
    lVar3 = sVar1 * 0x70;
    do {
      std::ranges::__destroy_at_fn::operator()<slang::Diagnostic>
                ((__destroy_at_fn *)&std::ranges::destroy_at,pDVar2);
      pDVar2 = pDVar2 + 1;
      lVar3 = lVar3 + -0x70;
    } while (lVar3 != 0);
  }
  (this->warnings).super_SmallVector<slang::Diagnostic,_2UL>.
  super_SmallVectorBase<slang::Diagnostic>.len = 0;
  (this->disableRange).startLoc = (SourceLocation)0x0;
  (this->disableRange).endLoc = (SourceLocation)0x0;
  this->backtraceReported = false;
  return;
}

Assistant:

void EvalContext::reset() {
    steps = 0;
    disableTarget = nullptr;
    queueTarget = nullptr;
    stack.clear();
    lvalStack.clear();
    diags.clear();
    warnings.clear();
    disableRange = {};
    backtraceReported = false;
}